

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_bolelli_2018.h
# Opt level: O1

void __thiscall
DRAG<TTA>::PerformLabelingMem
          (DRAG<TTA> *this,vector<unsigned_long,_std::allocator<unsigned_long>_> *accesses)

{
  int *piVar1;
  char cVar2;
  char cVar3;
  undefined4 uVar4;
  Mat1b *pMVar5;
  long lVar6;
  long lVar7;
  pointer puVar8;
  pointer piVar9;
  DRAG<TTA> *pDVar10;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar11;
  uint uVar12;
  uint uVar13;
  long lVar14;
  ulong uVar15;
  int iVar16;
  long lVar17;
  int iVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  int iVar22;
  long lVar23;
  ulong uVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  double dVar28;
  MemMat<int> img_labels;
  MemMat<unsigned_char> img;
  undefined1 local_2e0 [104];
  Mat local_278 [16];
  long local_268;
  long *local_230;
  long local_218;
  DRAG<TTA> *local_210;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_208;
  long local_200;
  long local_1f8;
  long local_1f0;
  long local_1e8;
  long local_1e0;
  undefined1 local_1d8 [104];
  Mat local_170 [16];
  long local_160;
  long *local_128;
  Size local_110;
  undefined1 local_108 [8];
  void *pvStack_100;
  Size local_f8;
  undefined4 local_a8;
  Mat *local_a0;
  undefined8 local_98;
  Mat local_90 [96];
  
  cv::Mat::Mat(local_90,&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->super_Mat);
  MemMat<unsigned_char>::MemMat((MemMat<unsigned_char> *)local_1d8,(Mat_<unsigned_char> *)local_90);
  cv::Mat::~Mat(local_90);
  uVar24 = **(ulong **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x40;
  local_110 = (Size)(uVar24 << 0x20 | uVar24 >> 0x20);
  MemMat<int>::MemMat((MemMat<int> *)local_2e0,&local_110,0);
  pMVar5 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  iVar22 = *(int *)&pMVar5->field_0x8;
  iVar18 = *(int *)&pMVar5->field_0xc;
  TTA::MemAlloc(((iVar18 - (iVar18 + 1 >> 0x1f)) + 1 >> 1) *
                ((iVar22 - (iVar22 + 1 >> 0x1f)) + 1 >> 1) + 1);
  *TTA::mem_rtable_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
   super__Vector_impl_data._M_start =
       *TTA::mem_rtable_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start + 1;
  *TTA::mem_rtable_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
   super__Vector_impl_data._M_start = 0;
  TTA::length_ = 1;
  pMVar5 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  uVar13 = *(uint *)&pMVar5->field_0x8;
  iVar22 = *(int *)&pMVar5->field_0xc;
  local_210 = this;
  local_208 = accesses;
  if (0 < iVar22) {
    iVar18 = 0;
    do {
      lVar25 = (long)iVar18;
      piVar1 = (int *)(local_160 + lVar25 * 4);
      *piVar1 = *piVar1 + 1;
      if (*(char *)(local_1d8._24_8_ + lVar25) != '\0') {
        uVar12 = TTA::MemNewLabel();
        piVar1 = (int *)(local_268 + lVar25 * 4);
        *piVar1 = *piVar1 + 1;
        *(uint *)(local_2e0._24_8_ + lVar25 * 4) = uVar12;
        lVar25 = lVar25 + 1;
        if (iVar22 <= (int)lVar25) break;
        lVar19 = 0;
        while( true ) {
          piVar1 = (int *)(lVar25 * 4 + local_160 + lVar19 * 4);
          *piVar1 = *piVar1 + 1;
          if (*(char *)(local_1d8._24_8_ + lVar25 + lVar19) == '\0') break;
          lVar26 = (long)(iVar18 + (int)lVar19);
          piVar1 = (int *)(local_268 + lVar26 * 4);
          *piVar1 = *piVar1 + 1;
          uVar4 = *(undefined4 *)(local_2e0._24_8_ + lVar26 * 4);
          piVar1 = (int *)(local_268 + lVar25 * 4 + lVar19 * 4);
          *piVar1 = *piVar1 + 1;
          *(undefined4 *)(local_2e0._24_8_ + lVar25 * 4 + lVar19 * 4) = uVar4;
          lVar19 = lVar19 + 1;
          if ((1 - iVar22) + iVar18 + (int)lVar19 == 0) goto LAB_001200e2;
        }
        iVar18 = iVar18 + (int)lVar19 + 1;
      }
      iVar18 = iVar18 + 1;
    } while (iVar18 < iVar22);
  }
LAB_001200e2:
  if (1 < (int)uVar13) {
    iVar22 = iVar22 + -1;
    local_1e0 = (long)iVar22;
    local_1f0 = local_1e0 + -1;
    local_1f8 = -local_1e0;
    uVar24 = 1;
    lVar25 = 0;
    do {
      if (iVar22 == 0) {
        lVar19 = *local_128;
        piVar1 = (int *)(local_160 + lVar19 * uVar24);
        *piVar1 = *piVar1 + 1;
        lVar26 = *(long *)local_1d8._80_8_;
        if (*(char *)(local_1d8._24_8_ + lVar26 * uVar24) != '\0') {
          lVar20 = uVar24 - 1;
          piVar1 = (int *)(local_160 + lVar19 * lVar20);
          *piVar1 = *piVar1 + 1;
          if (*(char *)(local_1d8._24_8_ + lVar26 * lVar20) == '\0') {
            uVar12 = TTA::MemNewLabel();
            piVar1 = (int *)(local_268 + *local_230 * uVar24);
            *piVar1 = *piVar1 + 1;
            *(uint *)(local_2e0._24_8_ + *(long *)local_2e0._80_8_ * uVar24) = uVar12;
          }
          else {
            lVar19 = *local_230;
            piVar1 = (int *)(local_268 + lVar19 * lVar20);
            *piVar1 = *piVar1 + 1;
            lVar26 = *(long *)local_2e0._80_8_;
            uVar4 = *(undefined4 *)(local_2e0._24_8_ + lVar20 * lVar26);
            piVar1 = (int *)(local_268 + lVar19 * uVar24);
            *piVar1 = *piVar1 + 1;
            *(undefined4 *)(local_2e0._24_8_ + lVar26 * uVar24) = uVar4;
          }
        }
      }
      else {
        lVar19 = *local_128;
        piVar1 = (int *)(local_160 + lVar19 * uVar24);
        *piVar1 = *piVar1 + 1;
        lVar26 = *(long *)local_1d8._80_8_;
        if (*(char *)(local_1d8._24_8_ + lVar26 * uVar24) == '\0') {
          uVar15 = 0;
          goto LAB_00120274;
        }
        lVar20 = uVar24 - 1;
        lVar19 = lVar19 * lVar20;
        piVar1 = (int *)(local_160 + lVar19);
        *piVar1 = *piVar1 + 1;
        lVar26 = lVar26 * lVar20;
        if (*(char *)(local_1d8._24_8_ + lVar26) == '\0') {
          piVar1 = (int *)(local_160 + 4 + lVar19);
          *piVar1 = *piVar1 + 1;
          if (*(char *)(local_1d8._24_8_ + 1 + lVar26) == '\0') {
            uVar12 = TTA::MemNewLabel();
            piVar1 = (int *)(local_268 + *local_230 * uVar24);
            *piVar1 = *piVar1 + 1;
            *(uint *)(local_2e0._24_8_ + *(long *)local_2e0._80_8_ * uVar24) = uVar12;
            iVar18 = 0;
            goto LAB_001207e0;
          }
          lVar19 = *local_230;
          piVar1 = (int *)(local_268 + 4 + lVar19 * lVar20);
          *piVar1 = *piVar1 + 1;
          lVar26 = *(long *)local_2e0._80_8_;
          uVar4 = *(undefined4 *)(local_2e0._24_8_ + 4 + lVar20 * lVar26);
          piVar1 = (int *)(local_268 + lVar19 * uVar24);
          *piVar1 = *piVar1 + 1;
          *(undefined4 *)(local_2e0._24_8_ + lVar26 * uVar24) = uVar4;
          uVar15 = 0;
          goto LAB_00120a53;
        }
        lVar19 = *local_230;
        piVar1 = (int *)(local_268 + lVar19 * lVar20);
        *piVar1 = *piVar1 + 1;
        lVar26 = *(long *)local_2e0._80_8_;
        uVar4 = *(undefined4 *)(local_2e0._24_8_ + lVar20 * lVar26);
        piVar1 = (int *)(local_268 + lVar19 * uVar24);
        *piVar1 = *piVar1 + 1;
        *(undefined4 *)(local_2e0._24_8_ + lVar26 * uVar24) = uVar4;
        uVar15 = 0;
LAB_00120af5:
        iVar18 = (int)uVar15;
        iVar16 = iVar18 + 1;
        if (iVar16 < iVar22) {
          lVar26 = *local_128;
          lVar20 = *(long *)local_1d8._80_8_;
          local_200 = uVar24 - 1;
          local_218 = lVar26 * local_200 + local_160;
          local_1e8 = lVar20 * local_200 + local_1d8._24_8_;
          lVar23 = (long)iVar18;
          lVar19 = local_2e0._24_8_ + 4 + lVar23 * 4;
          lVar14 = local_268 + lVar23 * 4 + 4;
          lVar27 = 0;
          while( true ) {
            piVar1 = (int *)(lVar26 * uVar24 + lVar23 * 4 + local_160 + 4 + lVar27 * 4);
            *piVar1 = *piVar1 + 1;
            iVar16 = (int)(lVar23 + 1);
            if (*(char *)(lVar20 * uVar24 + lVar23 + local_1d8._24_8_ + 1 + lVar27) == '\0') {
              uVar15 = (ulong)(uint)(iVar16 + (int)lVar27);
              goto LAB_00120274;
            }
            piVar1 = (int *)(local_160 + lVar26 * lVar25 + lVar23 * 4 + 4 + lVar27 * 4);
            *piVar1 = *piVar1 + 1;
            if (*(char *)(local_1d8._24_8_ + lVar20 * lVar25 + lVar23 + 1 + lVar27) == '\0') break;
            lVar21 = *local_230;
            piVar1 = (int *)(lVar25 * lVar21 + lVar14 + lVar27 * 4);
            *piVar1 = *piVar1 + 1;
            lVar17 = *(long *)local_2e0._80_8_;
            uVar4 = *(undefined4 *)(lVar25 * lVar17 + lVar19 + lVar27 * 4);
            piVar1 = (int *)(lVar21 * uVar24 + lVar14 + lVar27 * 4);
            *piVar1 = *piVar1 + 1;
            *(undefined4 *)(lVar17 * uVar24 + lVar19 + lVar27 * 4) = uVar4;
            lVar27 = lVar27 + 1;
            if (local_1f8 + lVar23 + 1 + lVar27 == 0) {
              iVar18 = iVar18 + (int)lVar27;
              iVar16 = iVar16 + (int)lVar27;
              goto LAB_00120c67;
            }
          }
          iVar16 = iVar18 + (int)lVar27;
          lVar26 = (long)(iVar16 + 2);
          piVar1 = (int *)(local_218 + lVar26 * 4);
          *piVar1 = *piVar1 + 1;
          uVar15 = lVar23 + 1 + lVar27;
          iVar18 = (int)uVar15;
          lVar19 = (long)iVar16;
          if (*(char *)(local_1e8 + lVar26) == '\0') {
            lVar26 = *local_230 * uVar24 + local_268;
            piVar1 = (int *)(lVar26 + lVar19 * 4);
            *piVar1 = *piVar1 + 1;
            lVar20 = *(long *)local_2e0._80_8_ * uVar24 + local_2e0._24_8_;
            uVar4 = *(undefined4 *)(lVar20 + lVar19 * 4);
            piVar1 = (int *)(lVar26 + lVar23 * 4 + 4 + lVar27 * 4);
            *piVar1 = *piVar1 + 1;
            *(undefined4 *)(lVar20 + lVar23 * 4 + 4 + lVar27 * 4) = uVar4;
            goto LAB_001207e0;
          }
          lVar20 = *local_230;
          piVar1 = (int *)(lVar20 * uVar24 + local_268 + lVar19 * 4);
          *piVar1 = *piVar1 + 1;
          lVar14 = *(long *)local_2e0._80_8_;
          uVar12 = *(uint *)(lVar14 * uVar24 + local_2e0._24_8_ + lVar19 * 4);
          piVar1 = (int *)(lVar20 * local_200 + local_268 + lVar26 * 4);
          *piVar1 = *piVar1 + 1;
          uVar12 = TTA::MemMerge(uVar12,*(uint *)(lVar14 * local_200 + local_2e0._24_8_ + lVar26 * 4
                                                 ));
          piVar1 = (int *)(*local_230 * uVar24 + local_268 + lVar23 * 4 + 4 + lVar27 * 4);
          *piVar1 = *piVar1 + 1;
          *(uint *)(*(long *)local_2e0._80_8_ * uVar24 + local_2e0._24_8_ + lVar23 * 4 + 4 +
                   lVar27 * 4) = uVar12;
LAB_00120a53:
          lVar19 = (long)(int)uVar15;
          piVar1 = (int *)(*local_128 * uVar24 + local_160 + 4 + lVar19 * 4);
          *piVar1 = *piVar1 + 1;
          uVar15 = lVar19 + 1;
          cVar3 = *(char *)(lVar19 + 1 + *(long *)local_1d8._80_8_ * uVar24 + local_1d8._24_8_);
          if (iVar22 <= (int)uVar15) {
            if (cVar3 != '\0') {
              lVar26 = *local_230;
              piVar1 = (int *)(lVar26 * (uVar24 - 1) + local_268 + 4 + lVar19 * 4);
              *piVar1 = *piVar1 + 1;
              lVar20 = *(long *)local_2e0._80_8_;
              uVar4 = *(undefined4 *)((uVar24 - 1) * lVar20 + local_2e0._24_8_ + 4 + lVar19 * 4);
              piVar1 = (int *)(lVar26 * uVar24 + local_268 + 4 + lVar19 * 4);
              *piVar1 = *piVar1 + 1;
              *(undefined4 *)(lVar20 * uVar24 + local_2e0._24_8_ + 4 + lVar19 * 4) = uVar4;
            }
            goto LAB_00120eb4;
          }
          if (cVar3 != '\0') {
            lVar26 = *local_230;
            piVar1 = (int *)(lVar26 * (uVar24 - 1) + local_268 + 4 + lVar19 * 4);
            *piVar1 = *piVar1 + 1;
            lVar20 = *(long *)local_2e0._80_8_;
            uVar4 = *(undefined4 *)((uVar24 - 1) * lVar20 + local_2e0._24_8_ + 4 + lVar19 * 4);
            piVar1 = (int *)(lVar26 * uVar24 + local_268 + 4 + lVar19 * 4);
            *piVar1 = *piVar1 + 1;
            *(undefined4 *)(lVar20 * uVar24 + local_2e0._24_8_ + 4 + lVar19 * 4) = uVar4;
            goto LAB_00120af5;
          }
LAB_00120274:
          while( true ) {
            lVar14 = (long)(int)uVar15;
            lVar19 = local_160 + lVar14 * 4;
            lVar26 = lVar14 << 0x20;
            lVar20 = 0;
            do {
              lVar23 = lVar26;
              lVar27 = lVar23 >> 0x20;
              if (local_1e0 <= lVar14 + lVar20 + 1) {
                lVar19 = *local_128;
                lVar20 = lVar23 + 0x100000000 >> 0x20;
                piVar1 = (int *)((lVar23 + 0x100000000 >> 0x1e) + lVar19 * uVar24 + local_160);
                *piVar1 = *piVar1 + 1;
                lVar26 = *(long *)local_1d8._80_8_;
                if (*(char *)(lVar20 + lVar26 * uVar24 + local_1d8._24_8_) != '\0') {
                  lVar14 = uVar24 - 1;
                  lVar19 = local_160 + lVar19 * lVar14;
                  piVar1 = (int *)(lVar19 + lVar20 * 4);
                  *piVar1 = *piVar1 + 1;
                  lVar26 = local_1d8._24_8_ + lVar26 * lVar14;
                  if (*(char *)(lVar20 + lVar26) == '\0') {
                    piVar1 = (int *)(lVar19 + (lVar23 >> 0x1e));
                    *piVar1 = *piVar1 + 1;
                    if (*(char *)(lVar26 + lVar27) == '\0') {
                      uVar12 = TTA::MemNewLabel();
                      piVar1 = (int *)(*local_230 * uVar24 + local_268 + lVar20 * 4);
                      *piVar1 = *piVar1 + 1;
                      *(uint *)(*(long *)local_2e0._80_8_ * uVar24 + local_2e0._24_8_ + lVar20 * 4)
                           = uVar12;
                    }
                    else {
                      lVar19 = *local_230;
                      piVar1 = (int *)(lVar19 * lVar14 + local_268 + lVar27 * 4);
                      *piVar1 = *piVar1 + 1;
                      lVar26 = *(long *)local_2e0._80_8_;
                      uVar4 = *(undefined4 *)(lVar14 * lVar26 + local_2e0._24_8_ + lVar27 * 4);
                      piVar1 = (int *)(lVar19 * uVar24 + local_268 + lVar20 * 4);
                      *piVar1 = *piVar1 + 1;
                      *(undefined4 *)(lVar26 * uVar24 + local_2e0._24_8_ + lVar20 * 4) = uVar4;
                    }
                  }
                  else {
                    lVar19 = *local_230;
                    piVar1 = (int *)(lVar19 * lVar14 + local_268 + lVar20 * 4);
                    *piVar1 = *piVar1 + 1;
                    lVar26 = *(long *)local_2e0._80_8_;
                    uVar4 = *(undefined4 *)(lVar14 * lVar26 + local_2e0._24_8_ + lVar20 * 4);
                    piVar1 = (int *)(lVar19 * uVar24 + local_268 + lVar20 * 4);
                    *piVar1 = *piVar1 + 1;
                    *(undefined4 *)(lVar26 * uVar24 + local_2e0._24_8_ + lVar20 * 4) = uVar4;
                  }
                }
                goto LAB_00120eb4;
              }
              lVar6 = *local_128;
              piVar1 = (int *)(uVar24 * lVar6 + lVar19 + 4 + lVar20 * 4);
              *piVar1 = *piVar1 + 1;
              lVar7 = *(long *)local_1d8._80_8_;
              lVar21 = lVar20 + 1;
              lVar17 = lVar20 + 1;
              lVar26 = lVar23 + 0x100000000;
              lVar20 = lVar21;
            } while (*(char *)(lVar17 + uVar24 * lVar7 + local_1d8._24_8_ + lVar14) == '\0');
            uVar15 = (uVar15 & 0xffffffff) + lVar21;
            iVar18 = (int)uVar15;
            piVar1 = (int *)(lVar19 + lVar25 * lVar6 + lVar21 * 4);
            *piVar1 = *piVar1 + 1;
            if (*(char *)(lVar21 + local_1d8._24_8_ + lVar14 + lVar25 * lVar7) != '\0') {
              lVar19 = *local_230;
              piVar1 = (int *)(lVar19 * lVar25 + local_268 + lVar14 * 4 + lVar21 * 4);
              *piVar1 = *piVar1 + 1;
              lVar26 = *(long *)local_2e0._80_8_;
              uVar4 = *(undefined4 *)(lVar26 * lVar25 + local_2e0._24_8_ + lVar14 * 4 + lVar21 * 4);
              piVar1 = (int *)(lVar19 * uVar24 + local_268 + lVar14 * 4 + lVar21 * 4);
              *piVar1 = *piVar1 + 1;
              *(undefined4 *)(lVar26 * uVar24 + local_2e0._24_8_ + lVar14 * 4 + lVar21 * 4) = uVar4;
              goto LAB_00120af5;
            }
            lVar19 = uVar24 - 1;
            lVar20 = local_160 + lVar6 * lVar19;
            lVar26 = local_1d8._24_8_ + lVar7 * lVar19;
            piVar1 = (int *)(lVar20 + (lVar23 + 0x200000000 >> 0x1e));
            *piVar1 = *piVar1 + 1;
            lVar17 = lVar23 + 0x200000000 >> 0x20;
            cVar3 = *(char *)(lVar26 + lVar17);
            piVar1 = (int *)(lVar20 + (lVar23 >> 0x1e));
            *piVar1 = *piVar1 + 1;
            cVar2 = *(char *)(lVar26 + lVar27);
            if (cVar3 != '\0') {
              if (cVar2 == '\0') {
                lVar26 = *local_230;
                piVar1 = (int *)(lVar26 * lVar19 + local_268 + lVar17 * 4);
                *piVar1 = *piVar1 + 1;
                lVar20 = *(long *)local_2e0._80_8_;
                uVar4 = *(undefined4 *)(lVar19 * lVar20 + local_2e0._24_8_ + lVar17 * 4);
                piVar1 = (int *)(lVar26 * uVar24 + local_268 + lVar14 * 4 + lVar21 * 4);
                *piVar1 = *piVar1 + 1;
                *(undefined4 *)(lVar20 * uVar24 + local_2e0._24_8_ + lVar14 * 4 + lVar21 * 4) =
                     uVar4;
              }
              else {
                lVar26 = *local_230 * lVar19 + local_268;
                piVar1 = (int *)(lVar26 + lVar27 * 4);
                *piVar1 = *piVar1 + 1;
                lVar19 = lVar19 * *(long *)local_2e0._80_8_ + local_2e0._24_8_;
                uVar12 = *(uint *)(lVar19 + lVar27 * 4);
                piVar1 = (int *)(lVar26 + lVar17 * 4);
                *piVar1 = *piVar1 + 1;
                uVar12 = TTA::MemMerge(uVar12,*(uint *)(lVar19 + lVar17 * 4));
                piVar1 = (int *)(*local_230 * uVar24 + local_268 + lVar14 * 4 + lVar21 * 4);
                *piVar1 = *piVar1 + 1;
                *(uint *)(*(long *)local_2e0._80_8_ * uVar24 + local_2e0._24_8_ + lVar14 * 4 +
                         lVar21 * 4) = uVar12;
              }
              goto LAB_00120a53;
            }
            if (cVar2 == '\0') {
              uVar12 = TTA::MemNewLabel();
              piVar1 = (int *)(*local_230 * uVar24 + local_268 + lVar14 * 4 + lVar21 * 4);
              *piVar1 = *piVar1 + 1;
              *(uint *)(*(long *)local_2e0._80_8_ * uVar24 + local_2e0._24_8_ + lVar14 * 4 +
                       lVar21 * 4) = uVar12;
            }
            else {
              lVar26 = *local_230;
              piVar1 = (int *)(lVar26 * lVar19 + local_268 + lVar27 * 4);
              *piVar1 = *piVar1 + 1;
              lVar20 = *(long *)local_2e0._80_8_;
              uVar4 = *(undefined4 *)(lVar19 * lVar20 + local_2e0._24_8_ + lVar27 * 4);
              piVar1 = (int *)(lVar26 * uVar24 + local_268 + lVar14 * 4 + lVar21 * 4);
              *piVar1 = *piVar1 + 1;
              *(undefined4 *)(lVar20 * uVar24 + local_2e0._24_8_ + lVar14 * 4 + lVar21 * 4) = uVar4;
            }
LAB_001207e0:
            iVar16 = iVar18 + 1;
            if (iVar22 <= iVar16) break;
            lVar19 = *local_128;
            lVar26 = *(long *)local_1d8._80_8_;
            lVar14 = (long)iVar18;
            iVar16 = iVar18 + 1;
            lVar20 = lVar14 << 0x20;
            lVar23 = 0;
            while( true ) {
              piVar1 = (int *)(local_160 + lVar19 * uVar24 + lVar14 * 4 + 4 + lVar23 * 4);
              *piVar1 = *piVar1 + 1;
              local_218 = lVar14;
              if (*(char *)(local_1d8._24_8_ + lVar26 * uVar24 + lVar14 + 1 + lVar23) == '\0')
              break;
              piVar1 = (int *)(lVar19 * lVar25 + lVar14 * 4 + local_160 + 8 + lVar23 * 4);
              *piVar1 = *piVar1 + 1;
              if (*(char *)(lVar26 * lVar25 + lVar14 + local_1d8._24_8_ + 2 + lVar23) != '\0') {
                uVar15 = (ulong)(uint)(iVar16 + (int)lVar23);
                lVar19 = *local_230;
                piVar1 = (int *)((lVar20 >> 0x1e) + lVar19 * uVar24 + local_268);
                *piVar1 = *piVar1 + 1;
                lVar26 = *(long *)local_2e0._80_8_;
                uVar12 = *(uint *)((lVar20 >> 0x1e) + lVar26 * uVar24 + local_2e0._24_8_);
                piVar1 = (int *)(lVar19 * lVar25 + local_268 + lVar14 * 4 + 8 + lVar23 * 4);
                *piVar1 = *piVar1 + 1;
                uVar12 = TTA::MemMerge(uVar12,*(uint *)(lVar26 * lVar25 + local_2e0._24_8_ +
                                                        lVar14 * 4 + 8 + lVar23 * 4));
                piVar1 = (int *)(*local_230 * uVar24 + local_268 + lVar14 * 4 + 4 + lVar23 * 4);
                *piVar1 = *piVar1 + 1;
                *(uint *)(*(long *)local_2e0._80_8_ * uVar24 + local_2e0._24_8_ + lVar14 * 4 + 4 +
                         lVar23 * 4) = uVar12;
                goto LAB_00120a53;
              }
              lVar27 = *local_230 * uVar24 + local_268 + lVar14 * 4 + 4;
              piVar1 = (int *)(lVar27 + -4 + lVar23 * 4);
              *piVar1 = *piVar1 + 1;
              lVar21 = *(long *)local_2e0._80_8_ * uVar24 + local_2e0._24_8_ + lVar14 * 4 + 4;
              uVar4 = *(undefined4 *)(lVar21 + -4 + lVar23 * 4);
              piVar1 = (int *)(lVar27 + lVar23 * 4);
              *piVar1 = *piVar1 + 1;
              *(undefined4 *)(lVar21 + lVar23 * 4) = uVar4;
              lVar20 = lVar20 + 0x100000000;
              lVar23 = lVar23 + 1;
              if (local_1f0 - lVar14 == lVar23) {
                iVar18 = iVar18 + (int)lVar23;
                iVar16 = iVar16 + (int)lVar23;
                goto LAB_00120922;
              }
            }
            uVar15 = (ulong)(uint)(iVar16 + (int)lVar23);
          }
LAB_00120922:
          lVar19 = (long)iVar16;
          piVar1 = (int *)(*local_128 * uVar24 + local_160 + lVar19 * 4);
          *piVar1 = *piVar1 + 1;
          if (*(char *)(lVar19 + *(long *)local_1d8._80_8_ * uVar24 + local_1d8._24_8_) == '\0')
          goto LAB_00120eb4;
          lVar26 = *local_230 * uVar24 + local_268;
          goto LAB_00120e97;
        }
LAB_00120c67:
        lVar26 = *local_128;
        lVar19 = (long)iVar16;
        piVar1 = (int *)(lVar26 * uVar24 + local_160 + lVar19 * 4);
        *piVar1 = *piVar1 + 1;
        lVar20 = *(long *)local_1d8._80_8_;
        if (*(char *)(lVar19 + lVar20 * uVar24 + local_1d8._24_8_) != '\0') {
          lVar14 = uVar24 - 1;
          piVar1 = (int *)(local_160 + lVar26 * lVar14 + lVar19 * 4);
          *piVar1 = *piVar1 + 1;
          if (*(char *)(lVar19 + local_1d8._24_8_ + lVar20 * lVar14) == '\0') {
            lVar26 = *local_230 * uVar24 + local_268;
LAB_00120e97:
            piVar1 = (int *)(lVar26 + (long)iVar18 * 4);
            *piVar1 = *piVar1 + 1;
            lVar20 = *(long *)local_2e0._80_8_ * uVar24 + local_2e0._24_8_;
            uVar4 = *(undefined4 *)(lVar20 + (long)iVar18 * 4);
            piVar1 = (int *)(lVar26 + lVar19 * 4);
            *piVar1 = *piVar1 + 1;
            *(undefined4 *)(lVar20 + lVar19 * 4) = uVar4;
          }
          else {
            lVar26 = *local_230;
            piVar1 = (int *)(lVar26 * lVar14 + local_268 + lVar19 * 4);
            *piVar1 = *piVar1 + 1;
            lVar20 = *(long *)local_2e0._80_8_;
            uVar4 = *(undefined4 *)(lVar14 * lVar20 + local_2e0._24_8_ + lVar19 * 4);
            piVar1 = (int *)(lVar26 * uVar24 + local_268 + lVar19 * 4);
            *piVar1 = *piVar1 + 1;
            *(undefined4 *)(lVar20 * uVar24 + local_2e0._24_8_ + lVar19 * 4) = uVar4;
          }
        }
      }
LAB_00120eb4:
      uVar24 = uVar24 + 1;
      lVar25 = lVar25 + 1;
    } while (uVar24 != uVar13);
  }
  uVar13 = TTA::MemFlatten();
  (local_210->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ = uVar13;
  piVar9 = TTA::mem_rtable_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar8 = TTA::mem_rtable_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)local_2e0._0_4_) {
    lVar25 = 0;
    do {
      if (0 < (int)local_2e0._4_4_) {
        lVar26 = *local_230 * lVar25 + local_268;
        lVar20 = *(long *)local_2e0._80_8_ * lVar25 + local_2e0._24_8_;
        lVar19 = 0;
        do {
          piVar1 = (int *)(lVar26 + lVar19 * 4);
          *piVar1 = *piVar1 + 1;
          iVar22 = *(int *)(lVar20 + lVar19 * 4);
          piVar9[iVar22] = piVar9[iVar22] + 1;
          uVar13 = puVar8[iVar22];
          piVar1 = (int *)(lVar26 + lVar19 * 4);
          *piVar1 = *piVar1 + 1;
          *(uint *)(lVar20 + lVar19 * 4) = uVar13;
          lVar19 = lVar19 + 1;
        } while (lVar19 < (int)local_2e0._4_4_);
      }
      lVar25 = lVar25 + 1;
    } while (lVar25 < (int)local_2e0._0_4_);
  }
  local_108 = (undefined1  [8])0x0;
  pvStack_100 = (void *)0x0;
  local_f8.width = 0;
  local_f8.height = 0;
  local_108 = (undefined1  [8])operator_new(0x20);
  pvVar11 = local_208;
  pvStack_100 = (void *)((long)local_108 + 0x20);
  *(undefined8 *)((long)local_108 + 0x10) = 0;
  *(undefined8 *)((long)local_108 + 0x18) = 0;
  *(undefined8 *)local_108 = 0;
  *(undefined8 *)((long)local_108 + 8) = 0;
  local_f8 = (Size)pvStack_100;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_move_assign(local_208,local_108);
  pDVar10 = local_210;
  if (local_108 != (undefined1  [8])0x0) {
    operator_delete((void *)local_108,(long)local_f8 - (long)local_108);
  }
  local_98 = 0;
  local_a8 = 0x81010004;
  local_a0 = local_170;
  cv::sum((_InputArray *)local_108);
  *(pvVar11->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
   super__Vector_impl_data._M_start =
       (long)((double)local_108 - 9.223372036854776e+18) & (long)(double)local_108 >> 0x3f |
       (long)(double)local_108;
  local_98 = 0;
  local_a8 = 0x81010004;
  local_a0 = local_278;
  cv::sum((_InputArray *)local_108);
  (pvVar11->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  super__Vector_impl_data._M_start[1] =
       (long)(double)local_108 >> 0x3f & (long)((double)local_108 - 9.223372036854776e+18) |
       (long)(double)local_108;
  dVar28 = TTA::MemTotalAccesses();
  (pvVar11->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  super__Vector_impl_data._M_start[2] =
       (long)dVar28 >> 0x3f & (long)(dVar28 - 9.223372036854776e+18) | (long)dVar28;
  MemMat<int>::GetImage((Mat_<int> *)local_108,(MemMat<int> *)local_2e0);
  cv::Mat::operator=(&((pDVar10->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->super_Mat
                     ,(Mat *)local_108);
  cv::Mat::~Mat((Mat *)local_108);
  cv::Mat::~Mat(local_278);
  cv::Mat::~Mat((Mat *)(local_2e0 + 8));
  cv::Mat::~Mat(local_170);
  cv::Mat::~Mat((Mat *)(local_1d8 + 8));
  return;
}

Assistant:

void PerformLabelingMem(std::vector<uint64_t>& accesses)
    {

        MemMat<unsigned char> img(img_);
        MemMat<int> img_labels(img_.size(), 0); 

        LabelsSolver::MemAlloc(UPPER_BOUND_8_CONNECTIVITY);
        LabelsSolver::MemSetup();

        // First scan
        int w(img_.cols);
        int h(img_.rows);

#define CONDITION_X img(r,c)>0
#define CONDITION_P img(r-1,c-1)>0
#define CONDITION_Q img(r-1,c)>0
#define CONDITION_R img(r-1,c+1)>0

#define ACTION_1 // nothing to do 
#define ACTION_2 img_labels(r,c) = LabelsSolver::MemNewLabel(); // new label
#define ACTION_3 img_labels(r,c) = img_labels(r - 1, c - 1); // x <- p
#define ACTION_4 img_labels(r,c) = img_labels(r - 1, c); // x <- q
#define ACTION_5 img_labels(r,c) = img_labels(r - 1, c + 1); // x <- r
#define ACTION_6 img_labels(r,c) = img_labels(r, c - 1); // x <- s
#define ACTION_7 img_labels(r,c) = LabelsSolver::MemMerge(img_labels(r - 1, c - 1), img_labels(r - 1, c + 1)); // x <- p + r
#define ACTION_8 img_labels(r,c) = LabelsSolver::MemMerge(img_labels(r, c - 1), img_labels(r - 1, c + 1)); // x <- s + r

#define COLS w

        {
            int r = 0; 
#include "labeling_grana_2016_forest_0.inc.h"

        }

        for (int r = 1; r < h; ++r) {

#include "labeling_grana_2016_forest.inc.h"  

        }//End rows' for

#undef ACTION_1
#undef ACTION_2
#undef ACTION_3
#undef ACTION_4
#undef ACTION_5
#undef ACTION_6
#undef ACTION_7
#undef ACTION_8

#undef CONDITION_X
#undef CONDITION_P
#undef CONDITION_Q
#undef CONDITION_R

        n_labels_ = LabelsSolver::MemFlatten();

        // Second scan
        for (int r_i = 0; r_i < img_labels.rows; ++r_i) {
            for (int c_i = 0; c_i < img_labels.cols; ++c_i) {
                img_labels(r_i, c_i) = LabelsSolver::MemGetLabel(img_labels(r_i, c_i));
            }
        }

        // Store total accesses in the output vector 'accesses'
        accesses = std::vector<uint64_t>((int)MD_SIZE, 0);

        accesses[MD_BINARY_MAT] = (uint64_t)img.GetTotalAccesses();
        accesses[MD_LABELED_MAT] = (uint64_t)img_labels.GetTotalAccesses();
        accesses[MD_EQUIVALENCE_VEC] = (uint64_t)LabelsSolver::MemTotalAccesses();

        img_labels_ = img_labels.GetImage(); 

        LabelsSolver::MemDealloc();
    }